

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixOpen(sqlite3_vfs *pVfs,char *zPath,sqlite3_file *pFile,int flags,int *pOutFlags)

{
  pid_t pVar1;
  uint uVar2;
  __pid_t _Var3;
  int iVar4;
  int *piVar5;
  bool local_29a;
  bool local_299;
  gid_t local_294;
  int rc2;
  gid_t gid;
  uid_t uid;
  mode_t openMode;
  UnixUnusedFd *pUnused;
  char *zName;
  char zTmpname [514];
  int isNewJrnl;
  int isReadWrite;
  int isReadonly;
  int isCreate;
  int isDelete;
  int isExclusive;
  int ctrlFlags;
  int rc;
  int noLock;
  int eType;
  int openFlags;
  int fd;
  unixFile *p;
  int *pOutFlags_local;
  int flags_local;
  sqlite3_file *pFile_local;
  char *zPath_local;
  sqlite3_vfs *pVfs_local;
  
  pVar1 = randomnessPid;
  eType = -1;
  uVar2 = flags & 0xffffff00;
  isDelete = 0;
  isNewJrnl = flags & 1;
  local_299 = false;
  if ((flags & 4U) != 0) {
    local_29a = true;
    if ((uVar2 != 0x4000) && (local_29a = true, uVar2 != 0x800)) {
      local_29a = uVar2 == 0x80000;
    }
    local_299 = local_29a;
  }
  register0x00000000 = (uint)local_299;
  pUnused = (UnixUnusedFd *)zPath;
  _Var3 = getpid();
  if (pVar1 != _Var3) {
    randomnessPid = getpid();
    sqlite3_randomness(0,(void *)0x0);
  }
  memset(pFile,0,0x78);
  if (uVar2 == 0x100) {
    _uid = (sqlite3_io_methods *)findReusableFd((char *)pUnused,flags);
    if (_uid == (sqlite3_io_methods *)0x0) {
      _uid = (sqlite3_io_methods *)sqlite3_malloc64(0x10);
      if (_uid == (sqlite3_io_methods *)0x0) {
        return 7;
      }
    }
    else {
      eType = _uid->iVersion;
    }
    pFile[6].pMethods = _uid;
  }
  else if (pUnused == (UnixUnusedFd *)0x0) {
    iVar4 = unixGetTempname(pVfs->mxPathname,(char *)&zName);
    if (iVar4 != 0) {
      return iVar4;
    }
    pUnused = (UnixUnusedFd *)&zName;
  }
  noLock = 0;
  if ((flags & 2U) != 0) {
    noLock = 2;
  }
  if ((flags & 4U) != 0) {
    noLock = noLock | 0x40;
  }
  if ((flags & 0x10U) != 0) {
    noLock = noLock | 0x20080;
  }
  pOutFlags_local._4_4_ = flags;
  if (eType < 0) {
    iVar4 = findCreateFileMode((char *)pUnused,flags,&gid,(uid_t *)&rc2,&local_294);
    if (iVar4 != 0) {
      return iVar4;
    }
    eType = robust_open((char *)pUnused,noLock,gid);
    isExclusive = 0;
    if (eType < 0) {
      if (((stack0xffffffffffffff90 == 0) || (piVar5 = __errno_location(), *piVar5 != 0xd)) ||
         (iVar4 = (*aSyscall[2].pCurrent)(pUnused,0), iVar4 == 0)) {
        piVar5 = __errno_location();
        if ((*piVar5 != 0x15) && ((flags & 2U) != 0)) {
          pOutFlags_local._4_4_ = flags & 0xfffffff9U | 1;
          isNewJrnl = 1;
          eType = robust_open((char *)pUnused,noLock & 0xffffffbd,gid);
        }
      }
      else {
        isExclusive = 0x608;
      }
    }
    if (eType < 0) {
      iVar4 = sqlite3CantopenError(0x96a5);
      iVar4 = unixLogErrorAtLine(iVar4,"open",(char *)pUnused,0x96a5);
      if (isExclusive == 0) {
        isExclusive = iVar4;
      }
      goto LAB_001444f8;
    }
    if ((pOutFlags_local._4_4_ & 0x80800) != 0) {
      robustFchown(eType,rc2,local_294);
    }
  }
  if (pOutFlags != (int *)0x0) {
    *pOutFlags = pOutFlags_local._4_4_;
  }
  if (pFile[6].pMethods != (sqlite3_io_methods *)0x0) {
    (pFile[6].pMethods)->iVersion = eType;
    *(uint *)&(pFile[6].pMethods)->field_0x4 = pOutFlags_local._4_4_;
  }
  if ((flags & 8U) != 0) {
    (*aSyscall[0x10].pCurrent)(pUnused);
    isDelete = 0x20;
  }
  if (isNewJrnl != 0) {
    isDelete = isDelete | 2;
  }
  if (uVar2 != 0x100) {
    isDelete = isDelete | 0x80;
  }
  if (unique0x10000227 != 0) {
    isDelete = isDelete | 8;
  }
  if ((pOutFlags_local._4_4_ & 0x40) != 0) {
    isDelete = isDelete | 0x40;
  }
  isExclusive = fillInUnixFile(pVfs,eType,pFile,zPath,isDelete);
LAB_001444f8:
  if (isExclusive != 0) {
    sqlite3_free(pFile[6].pMethods);
  }
  return isExclusive;
}

Assistant:

static int unixOpen(
  sqlite3_vfs *pVfs,           /* The VFS for which this is the xOpen method */
  const char *zPath,           /* Pathname of file to be opened */
  sqlite3_file *pFile,         /* The file descriptor to be filled in */
  int flags,                   /* Input flags to control the opening */
  int *pOutFlags               /* Output flags returned to SQLite core */
){
  unixFile *p = (unixFile *)pFile;
  int fd = -1;                   /* File descriptor returned by open() */
  int openFlags = 0;             /* Flags to pass to open() */
  int eType = flags&0xFFFFFF00;  /* Type of file to open */
  int noLock;                    /* True to omit locking primitives */
  int rc = SQLITE_OK;            /* Function Return Code */
  int ctrlFlags = 0;             /* UNIXFILE_* flags */

  int isExclusive  = (flags & SQLITE_OPEN_EXCLUSIVE);
  int isDelete     = (flags & SQLITE_OPEN_DELETEONCLOSE);
  int isCreate     = (flags & SQLITE_OPEN_CREATE);
  int isReadonly   = (flags & SQLITE_OPEN_READONLY);
  int isReadWrite  = (flags & SQLITE_OPEN_READWRITE);
#if SQLITE_ENABLE_LOCKING_STYLE
  int isAutoProxy  = (flags & SQLITE_OPEN_AUTOPROXY);
#endif
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  struct statfs fsInfo;
#endif

  /* If creating a master or main-file journal, this function will open
  ** a file-descriptor on the directory too. The first time unixSync()
  ** is called the directory file descriptor will be fsync()ed and close()d.
  */
  int isNewJrnl = (isCreate && (
        eType==SQLITE_OPEN_MASTER_JOURNAL 
     || eType==SQLITE_OPEN_MAIN_JOURNAL 
     || eType==SQLITE_OPEN_WAL
  ));

  /* If argument zPath is a NULL pointer, this function is required to open
  ** a temporary file. Use this buffer to store the file name in.
  */
  char zTmpname[MAX_PATHNAME+2];
  const char *zName = zPath;

  /* Check the following statements are true: 
  **
  **   (a) Exactly one of the READWRITE and READONLY flags must be set, and 
  **   (b) if CREATE is set, then READWRITE must also be set, and
  **   (c) if EXCLUSIVE is set, then CREATE must also be set.
  **   (d) if DELETEONCLOSE is set, then CREATE must also be set.
  */
  assert((isReadonly==0 || isReadWrite==0) && (isReadWrite || isReadonly));
  assert(isCreate==0 || isReadWrite);
  assert(isExclusive==0 || isCreate);
  assert(isDelete==0 || isCreate);

  /* The main DB, main journal, WAL file and master journal are never 
  ** automatically deleted. Nor are they ever temporary files.  */
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_DB );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MASTER_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_WAL );

  /* Assert that the upper layer has set one of the "file-type" flags. */
  assert( eType==SQLITE_OPEN_MAIN_DB      || eType==SQLITE_OPEN_TEMP_DB 
       || eType==SQLITE_OPEN_MAIN_JOURNAL || eType==SQLITE_OPEN_TEMP_JOURNAL 
       || eType==SQLITE_OPEN_SUBJOURNAL   || eType==SQLITE_OPEN_MASTER_JOURNAL 
       || eType==SQLITE_OPEN_TRANSIENT_DB || eType==SQLITE_OPEN_WAL
  );

  /* Detect a pid change and reset the PRNG.  There is a race condition
  ** here such that two or more threads all trying to open databases at
  ** the same instant might all reset the PRNG.  But multiple resets
  ** are harmless.
  */
  if( randomnessPid!=osGetpid(0) ){
    randomnessPid = osGetpid(0);
    sqlite3_randomness(0,0);
  }
  memset(p, 0, sizeof(unixFile));

  if( eType==SQLITE_OPEN_MAIN_DB ){
    UnixUnusedFd *pUnused;
    pUnused = findReusableFd(zName, flags);
    if( pUnused ){
      fd = pUnused->fd;
    }else{
      pUnused = sqlite3_malloc64(sizeof(*pUnused));
      if( !pUnused ){
        return SQLITE_NOMEM_BKPT;
      }
    }
    p->pPreallocatedUnused = pUnused;

    /* Database filenames are double-zero terminated if they are not
    ** URIs with parameters.  Hence, they can always be passed into
    ** sqlite3_uri_parameter(). */
    assert( (flags & SQLITE_OPEN_URI) || zName[strlen(zName)+1]==0 );

  }else if( !zName ){
    /* If zName is NULL, the upper layer is requesting a temp file. */
    assert(isDelete && !isNewJrnl);
    rc = unixGetTempname(pVfs->mxPathname, zTmpname);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    zName = zTmpname;

    /* Generated temporary filenames are always double-zero terminated
    ** for use by sqlite3_uri_parameter(). */
    assert( zName[strlen(zName)+1]==0 );
  }

  /* Determine the value of the flags parameter passed to POSIX function
  ** open(). These must be calculated even if open() is not called, as
  ** they may be stored as part of the file handle and used by the 
  ** 'conch file' locking functions later on.  */
  if( isReadonly )  openFlags |= O_RDONLY;
  if( isReadWrite ) openFlags |= O_RDWR;
  if( isCreate )    openFlags |= O_CREAT;
  if( isExclusive ) openFlags |= (O_EXCL|O_NOFOLLOW);
  openFlags |= (O_LARGEFILE|O_BINARY);

  if( fd<0 ){
    mode_t openMode;              /* Permissions to create file with */
    uid_t uid;                    /* Userid for the file */
    gid_t gid;                    /* Groupid for the file */
    rc = findCreateFileMode(zName, flags, &openMode, &uid, &gid);
    if( rc!=SQLITE_OK ){
      assert( !p->pPreallocatedUnused );
      assert( eType==SQLITE_OPEN_WAL || eType==SQLITE_OPEN_MAIN_JOURNAL );
      return rc;
    }
    fd = robust_open(zName, openFlags, openMode);
    OSTRACE(("OPENX   %-3d %s 0%o\n", fd, zName, openFlags));
    assert( !isExclusive || (openFlags & O_CREAT)!=0 );
    if( fd<0 ){
      if( isNewJrnl && errno==EACCES && osAccess(zName, F_OK) ){
        /* If unable to create a journal because the directory is not
        ** writable, change the error code to indicate that. */
        rc = SQLITE_READONLY_DIRECTORY;
      }else if( errno!=EISDIR && isReadWrite ){
        /* Failed to open the file for read/write access. Try read-only. */
        flags &= ~(SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE);
        openFlags &= ~(O_RDWR|O_CREAT);
        flags |= SQLITE_OPEN_READONLY;
        openFlags |= O_RDONLY;
        isReadonly = 1;
        fd = robust_open(zName, openFlags, openMode);
      }
    }
    if( fd<0 ){
      int rc2 = unixLogError(SQLITE_CANTOPEN_BKPT, "open", zName);
      if( rc==SQLITE_OK ) rc = rc2;
      goto open_finished;
    }

    /* If this process is running as root and if creating a new rollback
    ** journal or WAL file, set the ownership of the journal or WAL to be
    ** the same as the original database.
    */
    if( flags & (SQLITE_OPEN_WAL|SQLITE_OPEN_MAIN_JOURNAL) ){
      robustFchown(fd, uid, gid);
    }
  }
  assert( fd>=0 );
  if( pOutFlags ){
    *pOutFlags = flags;
  }

  if( p->pPreallocatedUnused ){
    p->pPreallocatedUnused->fd = fd;
    p->pPreallocatedUnused->flags = flags;
  }

  if( isDelete ){
#if OS_VXWORKS
    zPath = zName;
#elif defined(SQLITE_UNLINK_AFTER_CLOSE)
    zPath = sqlite3_mprintf("%s", zName);
    if( zPath==0 ){
      robust_close(p, fd, __LINE__);
      return SQLITE_NOMEM_BKPT;
    }
#else
    osUnlink(zName);
#endif
  }
#if SQLITE_ENABLE_LOCKING_STYLE
  else{
    p->openFlags = openFlags;
  }
#endif
  
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  if( fstatfs(fd, &fsInfo) == -1 ){
    storeLastErrno(p, errno);
    robust_close(p, fd, __LINE__);
    return SQLITE_IOERR_ACCESS;
  }
  if (0 == strncmp("msdos", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
  if (0 == strncmp("exfat", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
#endif

  /* Set up appropriate ctrlFlags */
  if( isDelete )                ctrlFlags |= UNIXFILE_DELETE;
  if( isReadonly )              ctrlFlags |= UNIXFILE_RDONLY;
  noLock = eType!=SQLITE_OPEN_MAIN_DB;
  if( noLock )                  ctrlFlags |= UNIXFILE_NOLOCK;
  if( isNewJrnl )               ctrlFlags |= UNIXFILE_DIRSYNC;
  if( flags & SQLITE_OPEN_URI ) ctrlFlags |= UNIXFILE_URI;

#if SQLITE_ENABLE_LOCKING_STYLE
#if SQLITE_PREFER_PROXY_LOCKING
  isAutoProxy = 1;
#endif
  if( isAutoProxy && (zPath!=NULL) && (!noLock) && pVfs->xOpen ){
    char *envforce = getenv("SQLITE_FORCE_PROXY_LOCKING");
    int useProxy = 0;

    /* SQLITE_FORCE_PROXY_LOCKING==1 means force always use proxy, 0 means 
    ** never use proxy, NULL means use proxy for non-local files only.  */
    if( envforce!=NULL ){
      useProxy = atoi(envforce)>0;
    }else{
      useProxy = !(fsInfo.f_flags&MNT_LOCAL);
    }
    if( useProxy ){
      rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);
      if( rc==SQLITE_OK ){
        rc = proxyTransformUnixFile((unixFile*)pFile, ":auto:");
        if( rc!=SQLITE_OK ){
          /* Use unixClose to clean up the resources added in fillInUnixFile 
          ** and clear all the structure's references.  Specifically, 
          ** pFile->pMethods will be NULL so sqlite3OsClose will be a no-op 
          */
          unixClose(pFile);
          return rc;
        }
      }
      goto open_finished;
    }
  }
#endif
  
  assert( zPath==0 || zPath[0]=='/' 
      || eType==SQLITE_OPEN_MASTER_JOURNAL || eType==SQLITE_OPEN_MAIN_JOURNAL 
  );
  rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);

open_finished:
  if( rc!=SQLITE_OK ){
    sqlite3_free(p->pPreallocatedUnused);
  }
  return rc;
}